

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalDelete::Deserialize(LogicalDelete *this,Deserializer *deserializer)

{
  __uniq_ptr_data<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true,_true>
  _Var1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_> this_00;
  ClientContext *context;
  pointer pLVar5;
  idx_t iVar6;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> table_info;
  unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true> result;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_30;
  _Head_base<0UL,_duckdb::LogicalDelete_*,_false> local_28;
  undefined4 extraout_var;
  
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"table_info");
  if ((char)iVar3 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_30._M_head_impl = (CreateInfo *)0x0;
  }
  else {
    local_30._M_head_impl = (CreateInfo *)0x0;
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 != '\0') {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      CreateInfo::Deserialize((CreateInfo *)&stack0xffffffffffffffd8,deserializer);
      local_30._M_head_impl = (CreateInfo *)local_28._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00._M_t.
  super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
  super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true,_true>
        )operator_new(0x98);
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  LogicalDelete((LogicalDelete *)
                this_00._M_t.
                super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
                .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl,context,
                (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                &local_30);
  local_28._M_head_impl =
       (LogicalDelete *)
       this_00._M_t.
       super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
       super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl;
  pLVar5 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
           operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                       *)&stack0xffffffffffffffd8);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"table_index");
  if ((char)uVar4 == '\0') {
    iVar6 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar6 = CONCAT44(extraout_var,iVar3);
  }
  pLVar5->table_index = iVar6;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pLVar5 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
           operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                       *)&stack0xffffffffffffffd8);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"return_chunk");
  if ((char)uVar4 == '\0') {
    uVar2 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar3;
  }
  pLVar5->return_chunk = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pLVar5 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
           operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                       *)&stack0xffffffffffffffd8);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xcb,"expressions",&(pLVar5->super_LogicalOperator).expressions);
  _Var1.super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
  super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl =
       (__uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>)
       (__uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>)
       local_28._M_head_impl;
  local_28._M_head_impl = (LogicalDelete *)0x0;
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)
       _Var1.
       super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
       super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl;
  if (local_30._M_head_impl != (CreateInfo *)0x0) {
    (*((local_30._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalDelete::Deserialize(Deserializer &deserializer) {
	auto table_info = deserializer.ReadPropertyWithDefault<unique_ptr<CreateInfo>>(200, "table_info");
	auto result = duckdb::unique_ptr<LogicalDelete>(new LogicalDelete(deserializer.Get<ClientContext &>(), table_info));
	deserializer.ReadPropertyWithDefault<idx_t>(201, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<bool>(202, "return_chunk", result->return_chunk);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(203, "expressions", result->expressions);
	return std::move(result);
}